

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O1

Stream * rw::writeSkin(Stream *stream,int32 len,void *object,int32 offset,int32 param_5)

{
  int iVar1;
  Skin *skin;
  Stream *pSVar2;
  long lVar3;
  long lVar4;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  iVar1 = version;
  if (*(int **)((long)object + 0x98) == (int *)0x0) {
    skin = *(Skin **)((long)object + (long)offset);
    local_2c = (undefined1)skin->numBones;
    if (version < 0x34000) {
      local_2b = 0;
      local_2a = 0;
    }
    else {
      local_2b = (undefined1)skin->numUsedBones;
      local_2a = (undefined1)skin->numWeights;
    }
    local_29 = 0;
    (*stream->_vptr_Stream[3])(stream,&local_2c,4);
    if (0x33fff < iVar1) {
      (*stream->_vptr_Stream[3])(stream,skin->usedBones,(ulong)(uint)skin->numUsedBones);
    }
    (*stream->_vptr_Stream[3])
              (stream,skin->indices,(ulong)(uint)(*(int *)((long)object + 0x1c) << 2));
    Stream::write32(stream,skin->weights,*(int *)((long)object + 0x1c) << 4);
    if (0 < skin->numBones) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        if (iVar1 < 0x34000) {
          Stream::writeU32(stream,0xdeaddead);
        }
        Stream::write32(stream,(void *)((long)skin->inverseMatrices + lVar4),0x40);
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x40;
      } while (lVar3 < skin->numBones);
    }
    if (0x33fff < iVar1) {
      writeSkinSplitData(stream,skin);
    }
  }
  else {
    iVar1 = **(int **)((long)object + 0x98);
    if (iVar1 == 0xb) {
      pSVar2 = wdgl::writeNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    if (iVar1 == 5) {
      pSVar2 = xbox::writeNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    if (iVar1 == 4) {
      pSVar2 = ps2::writeNativeSkin(stream,len,object,offset);
      return pSVar2;
    }
    stream = (Stream *)0x0;
  }
  return stream;
}

Assistant:

static Stream*
writeSkin(Stream *stream, int32 len, void *object, int32 offset, int32)
{
	uint8 header[4];
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::writeNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::writeNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::writeNativeSkin(stream, len, object, offset);
		else{
			assert(0 && "unsupported native skin platform");
			return nil;
		}
	}

	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	// not sure which version introduced the new format
	bool oldFormat = version < 0x34000;
	header[0] = skin->numBones;
	if(oldFormat){
		header[1] = 0;
		header[2] = 0;
	}else{
		header[1] = skin->numUsedBones;
		header[2] = skin->numWeights;
	}
	header[3] = 0;
	stream->write8(header, 4);
	if(!oldFormat)
		stream->write8(skin->usedBones, skin->numUsedBones);
	stream->write8(skin->indices, geometry->numVertices*4);
	stream->write32(skin->weights, geometry->numVertices*16);
	for(int32 i = 0; i < skin->numBones; i++){
		if(oldFormat)
			stream->writeU32(0xdeaddead);
		stream->write32(&skin->inverseMatrices[i*16], 64);
	}

	if(!oldFormat)
		writeSkinSplitData(stream, skin);
	return stream;
}